

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frattracer.cpp
# Opt level: O2

void __thiscall
CaDiCaL::FratTracer::frat_delete_clause
          (FratTracer *this,uint64_t id,vector<int,_std::allocator<int>_> *clause)

{
  int *piVar1;
  int *external_lit;
  int *piVar2;
  
  if (this->binary == true) {
    File::put(this->file,'d');
  }
  else {
    File::put(this->file,"d ");
  }
  if (this->binary == true) {
    put_binary_id(this,id);
  }
  else {
    File::put(this->file,id);
    File::put(this->file,"  ");
  }
  piVar1 = (clause->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar2 = (clause->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
    if (this->binary == false) {
      File::put(this->file,*piVar2);
      File::put(this->file,' ');
    }
    else {
      put_binary_lit(this,*piVar2);
    }
  }
  if (this->binary != false) {
    put_binary_zero(this);
    return;
  }
  File::put(this->file,"0\n");
  return;
}

Assistant:

void FratTracer::frat_delete_clause (uint64_t id,
                                     const vector<int> &clause) {
  if (binary)
    file->put ('d');
  else
    file->put ("d ");
  if (binary)
    put_binary_id (id);
  else
    file->put (id), file->put ("  ");
  for (const auto &external_lit : clause)
    if (binary)
      put_binary_lit (external_lit);
    else
      file->put (external_lit), file->put (' ');
  if (binary)
    put_binary_zero ();
  else
    file->put ("0\n");
}